

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_list_data.cpp
# Opt level: O1

void duckdb::ArrowFixedSizeListData::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  LogicalType *type_00;
  reference pvVar1;
  ArrowArray *pAVar2;
  reference pvVar3;
  long lVar4;
  byte bVar5;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_28;
  
  bVar5 = 0;
  result->n_buffers = 1;
  type_00 = ArrayType::GetChildType(type);
  ArrowAppender::AddChildren(append_data,1);
  result->children =
       (append_data->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  result->n_children = 1;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::operator[](&append_data->child_data,0);
  local_28._M_head_impl =
       (pvVar1->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (pvVar1->super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar2 = ArrowAppender::FinalizeChild
                     (type_00,(unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                               *)&local_28);
  pvVar3 = vector<ArrowArray,_true>::operator[](&append_data->child_arrays,0);
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pvVar3->length = pAVar2->length;
    pAVar2 = (ArrowArray *)((long)pAVar2 + (ulong)bVar5 * -0x10 + 8);
    pvVar3 = (reference)((long)pvVar3 + (ulong)bVar5 * -0x10 + 8);
  }
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              &local_28);
  return;
}

Assistant:

void ArrowFixedSizeListData::Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
	result->n_buffers = 1;
	auto &child_type = ArrayType::GetChildType(type);
	ArrowAppender::AddChildren(append_data, 1);
	result->children = append_data.child_pointers.data();
	result->n_children = 1;
	append_data.child_arrays[0] = *ArrowAppender::FinalizeChild(child_type, std::move(append_data.child_data[0]));
}